

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swin_transformer.h
# Opt level: O0

void __thiscall
shift_window_transformer::SwinTransformer<float>::SwinTransformer
          (SwinTransformer<float> *this,array<int,_4UL> *layers,array<int,_4UL> *heads,int hiddenDim
          ,int inputChannels,int numClasses,int headDim,int windowSize,
          array<int,_4UL> *downscalingFactors,bool relativePosEmbedding)

{
  int iVar1;
  int iVar2;
  const_reference pvVar3;
  bool relativePosEmbedding_local;
  int numClasses_local;
  int inputChannels_local;
  int hiddenDim_local;
  array<int,_4UL> *heads_local;
  array<int,_4UL> *layers_local;
  SwinTransformer<float> *this_local;
  
  Layer<float>::Layer((Layer<float> *)this);
  *(undefined ***)this = &PTR_forward_0011c910;
  *(undefined ***)this = &PTR_forward_0011c910;
  pvVar3 = std::array<int,_4UL>::operator[](layers,0);
  iVar1 = *pvVar3;
  pvVar3 = std::array<int,_4UL>::operator[](downscalingFactors,0);
  iVar2 = *pvVar3;
  pvVar3 = std::array<int,_4UL>::operator[](heads,0);
  StageModule<float>::StageModule
            (&this->stage1,inputChannels,hiddenDim,iVar1,iVar2,*pvVar3,headDim,windowSize,
             relativePosEmbedding);
  pvVar3 = std::array<int,_4UL>::operator[](layers,1);
  iVar1 = *pvVar3;
  pvVar3 = std::array<int,_4UL>::operator[](downscalingFactors,1);
  iVar2 = *pvVar3;
  pvVar3 = std::array<int,_4UL>::operator[](heads,1);
  StageModule<float>::StageModule
            (&this->stage2,hiddenDim,hiddenDim * 2,iVar1,iVar2,*pvVar3,headDim,windowSize,
             relativePosEmbedding);
  pvVar3 = std::array<int,_4UL>::operator[](layers,2);
  iVar1 = *pvVar3;
  pvVar3 = std::array<int,_4UL>::operator[](downscalingFactors,2);
  iVar2 = *pvVar3;
  pvVar3 = std::array<int,_4UL>::operator[](heads,2);
  StageModule<float>::StageModule
            (&this->stage3,hiddenDim * 2,hiddenDim << 2,iVar1,iVar2,*pvVar3,headDim,windowSize,
             relativePosEmbedding);
  pvVar3 = std::array<int,_4UL>::operator[](layers,3);
  iVar1 = *pvVar3;
  pvVar3 = std::array<int,_4UL>::operator[](downscalingFactors,3);
  iVar2 = *pvVar3;
  pvVar3 = std::array<int,_4UL>::operator[](heads,3);
  StageModule<float>::StageModule
            (&this->stage4,hiddenDim << 2,hiddenDim << 3,iVar1,iVar2,*pvVar3,headDim,windowSize,
             relativePosEmbedding);
  LayerNorm<float>::LayerNorm(&this->layerNorm,hiddenDim << 3);
  Linear<float>::Linear(&this->linear,hiddenDim << 3,numClasses);
  return;
}

Assistant:

SwinTransformer(const std::array<int, 4> &layers, const std::array<int, 4> &heads, int hiddenDim,
                        int inputChannels,
                        int numClasses, int headDim, int windowSize, const std::array<int, 4> &downscalingFactors,
                        bool relativePosEmbedding) :
                stage1(inputChannels, hiddenDim, layers[0], downscalingFactors[0], heads[0], headDim,
                       windowSize, relativePosEmbedding),
                stage2(hiddenDim, hiddenDim * 2, layers[1], downscalingFactors[1], heads[1], headDim,
                       windowSize, relativePosEmbedding),
                stage3(hiddenDim * 2, hiddenDim * 4, layers[2], downscalingFactors[2], heads[2], headDim,
                       windowSize, relativePosEmbedding),
                stage4(hiddenDim * 4, hiddenDim * 8, layers[3], downscalingFactors[3], heads[3], headDim,
                       windowSize, relativePosEmbedding),
                layerNorm(hiddenDim * 8),
                linear(hiddenDim * 8, numClasses) {
        }